

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,unsigned_long>,std::hash<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::shared_ptr<vmips::VirtReg>const&>,std::tuple<>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,unsigned_long>,std::hash<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
           *this,size_t i,piecewise_construct_t *args,
          tuple<const_std::shared_ptr<vmips::VirtReg>_&> *args_1,tuple<> *args_2)

{
  const_iterator cVar1;
  _Head_base<0UL,_const_std::shared_ptr<vmips::VirtReg>_&,_false> local_28;
  
  local_28._M_head_impl =
       (args_1->super__Tuple_impl<0UL,_const_std::shared_ptr<vmips::VirtReg>_&>).
       super__Head_base<0UL,_const_std::shared_ptr<vmips::VirtReg>_&,_false>._M_head_impl;
  std::pair<std::shared_ptr<vmips::VirtReg>,unsigned_long>::
  pair<std::shared_ptr<vmips::VirtReg>const&>
            ((pair<std::shared_ptr<vmips::VirtReg>,unsigned_long> *)(*(long *)(this + 8) + i * 0x18)
             ,&local_28);
  local_28._M_head_impl = (shared_ptr<vmips::VirtReg> *)this;
  cVar1 = DecomposePair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,unsigned_long>,std::hash<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>::FindElement,std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>&>
                    ((FindElement *)&local_28,
                     (pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long> *)
                     (i * 0x18 + *(long *)(this + 8)));
  if (cVar1.inner_.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x825,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>, unsigned long>, std::hash<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::pair<const std::shared_ptr<vmips::VirtReg>, unsigned long>>>::emplace_at(size_t, Args &&...) [Policy = phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>, unsigned long>, Hash = std::hash<std::shared_ptr<vmips::VirtReg>>, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::pair<const std::shared_ptr<vmips::VirtReg>, unsigned long>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::shared_ptr<vmips::VirtReg> &>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }